

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O0

bool __thiscall
Fossilize::ConcurrentDatabase::set_bucket_path
          (ConcurrentDatabase *this,char *bucket_dirname_,char *bucket_basename_)

{
  char *bucket_basename__local;
  char *bucket_dirname__local;
  ConcurrentDatabase *this_local;
  
  if (bucket_dirname_ == (char *)0x0) {
    std::__cxx11::string::clear();
  }
  else {
    std::__cxx11::string::operator=((string *)&this->bucket_dirname,bucket_dirname_);
  }
  if (bucket_basename_ == (char *)0x0) {
    std::__cxx11::string::clear();
  }
  else {
    std::__cxx11::string::operator=((string *)&this->bucket_basename,bucket_basename_);
  }
  return true;
}

Assistant:

bool set_bucket_path(const char *bucket_dirname_, const char *bucket_basename_) override
	{
		if (bucket_dirname_)
			bucket_dirname = bucket_dirname_;
		else
			bucket_dirname.clear();

		if (bucket_basename_)
			bucket_basename = bucket_basename_;
		else
			bucket_basename.clear();

		return true;
	}